

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::checkIfGlobal(Assembler *this,string *line)

{
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  GlobalFirstError *this_01;
  string local_278;
  string local_258;
  undefined1 local_238 [8];
  string substr;
  stringstream ss;
  string_type local_90;
  undefined4 local_70;
  string local_60 [8];
  string globalString;
  smatch global;
  string *line_local;
  Assembler *this_local;
  
  this_00 = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&globalString.field_2 + 8);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results(this_00);
  std::__cxx11::string::string(local_60);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,this_00,&globalDirectiveReg_abi_cxx11_,0);
  if (bVar1) {
    if ((first & 1U) == 0) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_90,
            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&globalString.field_2 + 8),1);
      std::__cxx11::string::operator=(local_60,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)(substr.field_2._M_local_buf + 8),local_60,_Var3);
      while( true ) {
        bVar2 = std::ios::good();
        if ((bVar2 & 1) == 0) break;
        std::__cxx11::string::string((string *)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)(substr.field_2._M_local_buf + 8),(string *)local_238,',');
        removeSpaces(&local_258,this,(string *)local_238);
        std::__cxx11::string::operator=((string *)local_238,(string *)&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::string((string *)&local_278,(string *)local_238);
        processGlobalSecondPass(this,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)local_238);
      }
      this_local._7_1_ = true;
      local_70 = 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)(substr.field_2._M_local_buf + 8));
    }
    else {
      if ((isGlobalFirst & 1U) == 0) {
        this_01 = (GlobalFirstError *)__cxa_allocate_exception(8);
        *this_01 = (GlobalFirstError)0x0;
        GlobalFirstError::GlobalFirstError(this_01);
        __cxa_throw(this_01,&GlobalFirstError::typeinfo,GlobalFirstError::~GlobalFirstError);
      }
      this_local._7_1_ = true;
      local_70 = 1;
    }
  }
  else {
    this_local._7_1_ = false;
    local_70 = 1;
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)((long)&globalString.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool Assembler::checkIfGlobal(string line) {
    smatch global;
    string globalString;
    if (regex_match(line, global, globalDirectiveReg)) {
        if (first) {
            if (!isGlobalFirst) throw GlobalFirstError(); //mora global da bude prvi
            return true;
        } else {
            globalString = global.str(1);
            stringstream ss(globalString);
            while (ss.good()) {
                string substr;
                getline(ss, substr, ',');
                substr = removeSpaces(substr);
                processGlobalSecondPass(substr);
            }
            return true;
        }
    }
    return false;
}